

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

NULLCArray NULLCMemory::read_double_array(NULLCArray buffer,int offset,int elements)

{
  NULLCArray NVar1;
  bool bVar2;
  int in_R9D;
  NULLCArray NVar3;
  char *local_70;
  uint local_68;
  int elements_local;
  int offset_local;
  NULLCArray buffer_local;
  NULLCArray result;
  
  buffer_local.ptr._0_4_ = buffer.len;
  memset((void *)((long)&buffer_local.ptr + 4),0,0xc);
  NVar3.ptr = (char *)(ulong)(uint)buffer_local.ptr;
  NVar3.len = offset;
  bVar2 = check_access((NULLCMemory *)buffer.ptr,NVar3,3,elements,in_R9D);
  if (bVar2) {
    NVar3 = nullcAllocateArrayTyped(7,elements);
    local_70 = NVar3.ptr;
    local_68 = NVar3.len;
    buffer_local._4_8_ = local_70;
    result.ptr._0_4_ = local_68;
    memcpy(local_70,(NULLCMemory *)buffer.ptr + offset,(long)elements << 3);
  }
  NVar1.len = (uint)result.ptr;
  NVar1.ptr = (char *)buffer_local._4_8_;
  return NVar1;
}

Assistant:

NULLCArray read_double_array(NULLCArray buffer, int offset, int elements)
	{
		NULLCArray result = { 0, 0 };

		if(!check_access(buffer, offset, 3, elements))
			return result;

		result = nullcAllocateArrayTyped(NULLC_TYPE_DOUBLE, elements);

		memcpy(result.ptr, buffer.ptr + offset, sizeof(double) * elements);
		return result;
	}